

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong.c
# Opt level: O0

CURLcode Curl_pp_readresp(curl_socket_t sockfd,pingpong *pp,int *code,size_t *size)

{
  connectdata *conn_00;
  Curl_easy *data_00;
  connectdata *__dest;
  long lVar1;
  CURLcode CVar2;
  ulong uVar3;
  void *pvVar4;
  bool bVar5;
  size_t n;
  char *pcStack_78;
  _Bool restart;
  ssize_t clipamount;
  ssize_t i;
  CURLcode result;
  char *buf;
  Curl_easy *data;
  connectdata *conn;
  char *ptr;
  ssize_t gotbytes;
  char *pcStack_30;
  _Bool keepon;
  ssize_t perline;
  size_t *size_local;
  int *code_local;
  pingpong *pp_local;
  curl_socket_t sockfd_local;
  
  gotbytes._7_1_ = 1;
  conn_00 = pp->conn;
  data_00 = conn_00->data;
  __dest = (connectdata *)(data_00->state).buffer;
  i._4_4_ = CURLE_OK;
  *code = 0;
  *size = 0;
  conn = (connectdata *)((__dest->chunk).hexbuffer + (pp->nread_resp - 0x20));
  pcStack_30 = (char *)((long)conn - (long)pp->linestart_resp);
  perline = (ssize_t)size;
  size_local = (size_t *)code;
  code_local = (int *)pp;
  pp_local._0_4_ = sockfd;
  do {
    while( true ) {
      do {
        if ((ulong)(data_00->set).buffer_size <= *(ulong *)(code_local + 4) ||
            ((gotbytes._7_1_ & 1) == 0 || i._4_4_ != CURLE_OK)) {
          *(undefined1 *)(code_local + 8) = 0;
          return i._4_4_;
        }
        if (*(long *)code_local == 0) {
          i._4_4_ = Curl_read(conn_00,(curl_socket_t)pp_local,(char *)conn,
                              (data_00->set).buffer_size - *(long *)(code_local + 4),(ssize_t *)&ptr
                             );
          if (i._4_4_ == CURLE_AGAIN) {
            return CURLE_OK;
          }
          if ((i._4_4_ == CURLE_OK) && (0 < (long)ptr)) {
            i._4_4_ = CURLE_OK;
          }
          if (i._4_4_ != CURLE_OK) {
            gotbytes._7_1_ = 0;
          }
        }
        else {
          memcpy(conn,*(void **)code_local,*(size_t *)(code_local + 2));
          ptr = *(char **)(code_local + 2);
          (*Curl_cfree)(*(void **)code_local);
          code_local[0] = 0;
          code_local[1] = 0;
          code_local[2] = 0;
          code_local[3] = 0;
        }
      } while ((gotbytes._7_1_ & 1) == 0);
      if (0 < (long)ptr) break;
      gotbytes._7_1_ = 0;
      i._4_4_ = CURLE_RECV_ERROR;
      Curl_failf(data_00,"response reading failed");
    }
    pcStack_78 = (char *)0x0;
    (data_00->req).headerbytecount = (long)(ptr + (data_00->req).headerbytecount);
    *(char **)(code_local + 4) = ptr + *(long *)(code_local + 4);
    for (clipamount = 0; clipamount < (long)ptr; clipamount = clipamount + 1) {
      pcStack_30 = pcStack_30 + 1;
      if (*(char *)&conn->data == '\n') {
        if (((data_00->set).verbose & 1U) != 0) {
          Curl_debug(data_00,CURLINFO_HEADER_IN,*(char **)(code_local + 6),(size_t)pcStack_30,
                     conn_00);
        }
        CVar2 = Curl_client_write(conn_00,2,*(char **)(code_local + 6),(size_t)pcStack_30);
        if (CVar2 != CURLE_OK) {
          return CVar2;
        }
        uVar3 = (**(code **)(code_local + 0x1a))
                          (conn_00,*(undefined8 *)(code_local + 6),pcStack_30,size_local);
        i._4_4_ = CURLE_OK;
        if ((uVar3 & 1) != 0) {
          lVar1 = *(long *)(code_local + 6);
          memmove(__dest,*(void **)(code_local + 6),(long)conn - lVar1);
          *(char *)((long)__dest + ((long)conn - lVar1)) = '\0';
          gotbytes._7_1_ = 0;
          *(undefined1 **)(code_local + 6) = (undefined1 *)((long)&conn->data + 1);
          clipamount = clipamount + 1;
          *(undefined8 *)perline = *(undefined8 *)(code_local + 4);
          code_local[4] = 0;
          code_local[5] = 0;
          break;
        }
        pcStack_30 = (char *)0x0;
        *(undefined1 **)(code_local + 6) = (undefined1 *)((long)&conn->data + 1);
      }
      conn = (connectdata *)((long)&conn->data + 1);
    }
    if (((gotbytes._7_1_ & 1) == 0) && ((char *)clipamount != ptr)) {
      pcStack_78 = ptr + -clipamount;
      bVar5 = true;
    }
    else if ((gotbytes._7_1_ & 1) == 0) {
      bVar5 = (char *)clipamount == ptr;
    }
    else if ((pcStack_30 == ptr) && ((data_00->set).buffer_size / 2 < (long)ptr)) {
      Curl_infof(data_00,"Excessive server response line length received, %zd bytes. Stripping\n",
                 ptr);
      bVar5 = true;
      pcStack_78 = (char *)0x28;
    }
    else {
      bVar5 = (ulong)(data_00->set).buffer_size >> 1 < *(ulong *)(code_local + 4);
      if (bVar5) {
        pcStack_78 = pcStack_30;
      }
    }
    if (pcStack_78 != (char *)0x0) {
      *(char **)(code_local + 2) = pcStack_78;
      pvVar4 = (*Curl_cmalloc)(*(size_t *)(code_local + 2));
      *(void **)code_local = pvVar4;
      if (*(long *)code_local == 0) {
        return CURLE_OUT_OF_MEMORY;
      }
      memcpy(*(void **)code_local,*(void **)(code_local + 6),*(size_t *)(code_local + 2));
    }
    if (bVar5) {
      code_local[4] = 0;
      code_local[5] = 0;
      *(connectdata **)(code_local + 6) = __dest;
      pcStack_30 = (char *)0x0;
      conn = __dest;
    }
  } while( true );
}

Assistant:

CURLcode Curl_pp_readresp(curl_socket_t sockfd,
                          struct pingpong *pp,
                          int *code, /* return the server code if done */
                          size_t *size) /* size of the response */
{
  ssize_t perline; /* count bytes per line */
  bool keepon=TRUE;
  ssize_t gotbytes;
  char *ptr;
  struct connectdata *conn = pp->conn;
  struct Curl_easy *data = conn->data;
  char * const buf = data->state.buffer;
  CURLcode result = CURLE_OK;

  *code = 0; /* 0 for errors or not done */
  *size = 0;

  ptr=buf + pp->nread_resp;

  /* number of bytes in the current line, so far */
  perline = (ssize_t)(ptr-pp->linestart_resp);

  while((pp->nread_resp < (size_t)data->set.buffer_size) &&
        (keepon && !result)) {

    if(pp->cache) {
      /* we had data in the "cache", copy that instead of doing an actual
       * read
       *
       * pp->cache_size is cast to ssize_t here.  This should be safe, because
       * it would have been populated with something of size int to begin
       * with, even though its datatype may be larger than an int.
       */
      DEBUGASSERT((ptr+pp->cache_size) <= (buf+data->set.buffer_size+1));
      memcpy(ptr, pp->cache, pp->cache_size);
      gotbytes = (ssize_t)pp->cache_size;
      free(pp->cache);    /* free the cache */
      pp->cache = NULL;   /* clear the pointer */
      pp->cache_size = 0; /* zero the size just in case */
    }
    else {
#ifdef HAVE_GSSAPI
      enum protection_level prot = conn->data_prot;
      conn->data_prot = PROT_CLEAR;
#endif
      DEBUGASSERT((ptr + data->set.buffer_size - pp->nread_resp) <=
                  (buf + data->set.buffer_size + 1));
      result = Curl_read(conn, sockfd, ptr,
                         data->set.buffer_size - pp->nread_resp,
                         &gotbytes);
#ifdef HAVE_GSSAPI
      DEBUGASSERT(prot  > PROT_NONE && prot < PROT_LAST);
      conn->data_prot = prot;
#endif
      if(result == CURLE_AGAIN)
        return CURLE_OK; /* return */

      if(!result && (gotbytes > 0))
        /* convert from the network encoding */
        result = Curl_convert_from_network(data, ptr, gotbytes);
      /* Curl_convert_from_network calls failf if unsuccessful */

      if(result)
        /* Set outer result variable to this error. */
        keepon = FALSE;
    }

    if(!keepon)
      ;
    else if(gotbytes <= 0) {
      keepon = FALSE;
      result = CURLE_RECV_ERROR;
      failf(data, "response reading failed");
    }
    else {
      /* we got a whole chunk of data, which can be anything from one
       * byte to a set of lines and possible just a piece of the last
       * line */
      ssize_t i;
      ssize_t clipamount = 0;
      bool restart = FALSE;

      data->req.headerbytecount += (long)gotbytes;

      pp->nread_resp += gotbytes;
      for(i = 0; i < gotbytes; ptr++, i++) {
        perline++;
        if(*ptr=='\n') {
          /* a newline is CRLF in pp-talk, so the CR is ignored as
             the line isn't really terminated until the LF comes */

          /* output debug output if that is requested */
#ifdef HAVE_GSSAPI
          if(!conn->sec_complete)
#endif
            if(data->set.verbose)
              Curl_debug(data, CURLINFO_HEADER_IN,
                         pp->linestart_resp, (size_t)perline, conn);

          /*
           * We pass all response-lines to the callback function registered
           * for "headers". The response lines can be seen as a kind of
           * headers.
           */
          result = Curl_client_write(conn, CLIENTWRITE_HEADER,
                                     pp->linestart_resp, perline);
          if(result)
            return result;

          if(pp->endofresp(conn, pp->linestart_resp, perline, code)) {
            /* This is the end of the last line, copy the last line to the
               start of the buffer and zero terminate, for old times sake */
            size_t n = ptr - pp->linestart_resp;
            memmove(buf, pp->linestart_resp, n);
            buf[n]=0; /* zero terminate */
            keepon=FALSE;
            pp->linestart_resp = ptr+1; /* advance pointer */
            i++; /* skip this before getting out */

            *size = pp->nread_resp; /* size of the response */
            pp->nread_resp = 0; /* restart */
            break;
          }
          perline=0; /* line starts over here */
          pp->linestart_resp = ptr+1;
        }
      }

      if(!keepon && (i != gotbytes)) {
        /* We found the end of the response lines, but we didn't parse the
           full chunk of data we have read from the server. We therefore need
           to store the rest of the data to be checked on the next invoke as
           it may actually contain another end of response already! */
        clipamount = gotbytes - i;
        restart = TRUE;
        DEBUGF(infof(data, "Curl_pp_readresp_ %d bytes of trailing "
                     "server response left\n",
                     (int)clipamount));
      }
      else if(keepon) {

        if((perline == gotbytes) && (gotbytes > data->set.buffer_size/2)) {
          /* We got an excessive line without newlines and we need to deal
             with it. We keep the first bytes of the line then we throw
             away the rest. */
          infof(data, "Excessive server response line length received, "
                "%zd bytes. Stripping\n", gotbytes);
          restart = TRUE;

          /* we keep 40 bytes since all our pingpong protocols are only
             interested in the first piece */
          clipamount = 40;
        }
        else if(pp->nread_resp > (size_t)data->set.buffer_size/2) {
          /* We got a large chunk of data and there's potentially still
             trailing data to take care of, so we put any such part in the
             "cache", clear the buffer to make space and restart. */
          clipamount = perline;
          restart = TRUE;
        }
      }
      else if(i == gotbytes)
        restart = TRUE;

      if(clipamount) {
        pp->cache_size = clipamount;
        pp->cache = malloc(pp->cache_size);
        if(pp->cache)
          memcpy(pp->cache, pp->linestart_resp, pp->cache_size);
        else
          return CURLE_OUT_OF_MEMORY;
      }
      if(restart) {
        /* now reset a few variables to start over nicely from the start of
           the big buffer */
        pp->nread_resp = 0; /* start over from scratch in the buffer */
        ptr = pp->linestart_resp = buf;
        perline = 0;
      }

    } /* there was data */

  } /* while there's buffer left and loop is requested */

  pp->pending_resp = FALSE;

  return result;
}